

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O0

void __thiscall
JPolComponent_VectorImplementation::ZeroInitialization
          (JPolComponent_VectorImplementation *this,Index agI)

{
  reference ppPVar1;
  undefined8 uVar2;
  uint in_ESI;
  char *in_RDI;
  E *unaff_retaddr;
  PolicyPureVector *this_pol;
  PolicyPureVector *in_stack_ffffffffffffffe0;
  
  ppPVar1 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::operator[]
                      ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)
                       (in_RDI + 0x30),(ulong)in_ESI);
  if (*ppPVar1 == (value_type)0x0) {
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(unaff_retaddr,in_RDI);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  PolicyPureVector::ZeroInitialization(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void JPolComponent_VectorImplementation::ZeroInitialization(Index agI)
{
    PolicyPureVector* this_pol = this->_m_indivPols_PolicyPureVector[agI];
    if(this_pol == 0) 
    {
        throw E(" JPolComponent_VectorImplementation::ZeroInitialization(agI) this_pol is 0!?");
    }
    this_pol->ZeroInitialization();
}